

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

void __thiscall ON_BinaryArchive::Internal_ReportCRCError(ON_BinaryArchive *this)

{
  ON_BinaryArchive *this_local;
  
  this->m_crc_error_count = this->m_crc_error_count + 1;
  if (((this->m_3dm_table_status_list != (ON_3dmTableStatusLink *)0x0) &&
      (this->m_3dm_active_table == (this->m_3dm_table_status_list->m_table_status).m_table_type)) &&
     ((this->m_3dm_table_status_list->m_table_status).m_state != Finished)) {
    (this->m_3dm_table_status_list->m_table_status).m_crc_error_count =
         (this->m_3dm_table_status_list->m_table_status).m_crc_error_count + 1;
  }
  return;
}

Assistant:

void ON_BinaryArchive::Internal_ReportCRCError()
{
  m_crc_error_count++;
  if (nullptr != m_3dm_table_status_list 
    && m_3dm_active_table == m_3dm_table_status_list->m_table_status.m_table_type
    && ON_3dmArchiveTableStatus::TableState::Finished !=  m_3dm_table_status_list->m_table_status.m_state
    )
  {
    m_3dm_table_status_list->m_table_status.m_crc_error_count++;
  }
  return;
}